

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  int in_EDX;
  sqlite3 *in_RSI;
  Op *pOp;
  void *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  sqlite3 *db_00;
  
  db_00 = in_RSI;
  if (in_RSI != (sqlite3 *)0x0) {
    for (; in_stack_ffffffffffffffe0 = in_RSI,
        in_RSI < (sqlite3 *)(db_00->aLimit + (long)in_EDX * 6 + -0x1a);
        in_RSI = (sqlite3 *)&in_RSI->mutex) {
      freeP4(db_00,in_EDX,in_RSI);
    }
  }
  sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  if( aOp ){
    Op *pOp;
    for(pOp=aOp; pOp<&aOp[nOp]; pOp++){
      freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif     
    }
  }
  sqlite3DbFree(db, aOp);
}